

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

bool __thiscall leveldb::Compaction::ShouldStopBefore(Compaction *this,Slice *internal_key)

{
  InternalKeyComparator *pIVar1;
  VersionSet *pVVar2;
  FileMetaData *pFVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  pointer ppFVar8;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  ppFVar8 = (this->grandparents_).
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = this->input_version_->vset_;
  uVar7 = this->grandparent_index_;
  if (uVar7 < (ulong)((long)(this->grandparents_).
                            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8 >> 3)) {
    pIVar1 = &pVVar2->icmp_;
    do {
      pFVar3 = ppFVar8[uVar7];
      local_38 = *(undefined4 *)&(pFVar3->largest).rep_._M_dataplus._M_p;
      uStack_34 = *(undefined4 *)((long)&(pFVar3->largest).rep_._M_dataplus._M_p + 4);
      uStack_30 = (undefined4)(pFVar3->largest).rep_._M_string_length;
      uStack_2c = *(undefined4 *)((long)&(pFVar3->largest).rep_._M_string_length + 4);
      iVar6 = (*(pIVar1->super_Comparator)._vptr_Comparator[2])(pIVar1,internal_key,&local_38);
      if (iVar6 < 1) break;
      if (this->seen_key_ == true) {
        this->overlapped_bytes_ =
             this->overlapped_bytes_ +
             (this->grandparents_).
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_start[this->grandparent_index_]->file_size;
      }
      uVar7 = this->grandparent_index_ + 1;
      this->grandparent_index_ = uVar7;
      ppFVar8 = (this->grandparents_).
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->grandparents_).
                                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8 >> 3))
    ;
  }
  this->seen_key_ = true;
  lVar4 = this->overlapped_bytes_;
  lVar5 = pVVar2->options_->max_file_size * 10;
  if (lVar5 < lVar4) {
    this->overlapped_bytes_ = 0;
  }
  return lVar5 < lVar4;
}

Assistant:

bool Compaction::ShouldStopBefore(const Slice& internal_key) {
  const VersionSet* vset = input_version_->vset_;
  // Scan to find earliest grandparent file that contains key.
  const InternalKeyComparator* icmp = &vset->icmp_;
  while (grandparent_index_ < grandparents_.size() &&
         icmp->Compare(internal_key,
                       grandparents_[grandparent_index_]->largest.Encode()) >
             0) {
    if (seen_key_) {
      overlapped_bytes_ += grandparents_[grandparent_index_]->file_size;
    }
    grandparent_index_++;
  }
  seen_key_ = true;

  if (overlapped_bytes_ > MaxGrandParentOverlapBytes(vset->options_)) {
    // Too much overlap for current output; start new output
    overlapped_bytes_ = 0;
    return true;
  } else {
    return false;
  }
}